

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.cc
# Opt level: O2

ostringstream *
tinyusdz::fmt::detail::format_sv
          (ostringstream *ss,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sv)

{
  pointer pbVar1;
  const_iterator __begin2;
  pointer pbVar2;
  
  pbVar2 = (sv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (sv->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    for (; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
      std::operator<<((ostream *)ss,(string *)pbVar2);
    }
  }
  return ss;
}

Assistant:

std::ostringstream &format_sv(std::ostringstream &ss,
                              const std::vector<std::string> &sv) {
  if (sv.empty()) {
    return ss;
  }

  for (const auto &item : sv) {
    ss << item;
  }

  return ss;
}